

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

IRegistryHub * Catch::getRegistryHub(void)

{
  IRegistryHub *pIVar1;
  
  if ((anonymous_namespace)::getTheRegistryHub()::theRegistryHub == (IRegistryHub *)0x0) {
    pIVar1 = (IRegistryHub *)operator_new(0xd0);
    pIVar1->_vptr_IRegistryHub = (_func_int **)&PTR__RegistryHub_001907d8;
    pIVar1[1]._vptr_IRegistryHub = (_func_int **)&PTR__RegistryHub_00190830;
    TestRegistry::TestRegistry((TestRegistry *)(pIVar1 + 2));
    pIVar1[0xc]._vptr_IRegistryHub = (_func_int **)&PTR__ReporterRegistry_00190af0;
    *(undefined4 *)&pIVar1[0xe]._vptr_IRegistryHub = 0;
    pIVar1[0xf]._vptr_IRegistryHub = (_func_int **)0x0;
    pIVar1[0x10]._vptr_IRegistryHub = (_func_int **)(pIVar1 + 0xe);
    pIVar1[0x11]._vptr_IRegistryHub = (_func_int **)(pIVar1 + 0xe);
    pIVar1[0x12]._vptr_IRegistryHub = (_func_int **)0x0;
    pIVar1[0x13]._vptr_IRegistryHub = (_func_int **)0x0;
    pIVar1[0x14]._vptr_IRegistryHub = (_func_int **)0x0;
    pIVar1[0x15]._vptr_IRegistryHub = (_func_int **)0x0;
    pIVar1[0x16]._vptr_IRegistryHub = (_func_int **)&PTR__ExceptionTranslatorRegistry_00190b40;
    pIVar1[0x17]._vptr_IRegistryHub = (_func_int **)0x0;
    pIVar1[0x18]._vptr_IRegistryHub = (_func_int **)0x0;
    pIVar1[0x19]._vptr_IRegistryHub = (_func_int **)0x0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub = pIVar1;
  }
  return (anonymous_namespace)::getTheRegistryHub()::theRegistryHub;
}

Assistant:

inline RegistryHub*& getTheRegistryHub() {
            static RegistryHub* theRegistryHub = CATCH_NULL;
            if( !theRegistryHub )
                theRegistryHub = new RegistryHub();
            return theRegistryHub;
        }